

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  int iVar1;
  char *pcVar2;
  int local_20;
  int bPreserve_local;
  int n_local;
  Mem *pMem_local;
  
  if (((pMem->szMalloc < 1) || (bPreserve == 0)) || (pMem->z != pMem->zMalloc)) {
    if (0 < pMem->szMalloc) {
      sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
    }
    pcVar2 = (char *)sqlite3DbMallocRaw(pMem->db,(long)n);
    pMem->zMalloc = pcVar2;
    local_20 = bPreserve;
  }
  else {
    pcVar2 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,(long)n);
    pMem->zMalloc = pcVar2;
    pMem->z = pcVar2;
    local_20 = 0;
  }
  if (pMem->zMalloc == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    pMem_local._4_4_ = 7;
  }
  else {
    iVar1 = sqlite3DbMallocSize(pMem->db,pMem->zMalloc);
    pMem->szMalloc = iVar1;
    if ((local_20 != 0) && (pMem->z != (char *)0x0)) {
      memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
    }
    if ((pMem->flags & 0x400) != 0) {
      (*pMem->xDel)(pMem->z);
    }
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0xe3ff;
    pMem_local._4_4_ = 0;
  }
  return pMem_local._4_4_;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}